

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::CompExp(SQCompiler *this)

{
  long lVar1;
  SQOpcode op;
  
  ShiftExp(this);
LAB_0014cad9:
  do {
    while( true ) {
      while( true ) {
        lVar1 = this->_token;
        op = _OP_CMP;
        if (lVar1 != 0x3c) break;
        BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x14cb7c,0);
      }
      if (lVar1 != 0x137) break;
      op = _OP_INSTANCEOF;
LAB_0014cb5a:
      BIN_EXP<void(SQCompiler::*)()>(this,op,0x14cb7c,0);
    }
    if (lVar1 == 0x10a) {
      BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x14cb7c,0);
      goto LAB_0014cad9;
    }
    if (lVar1 != 0x10b) {
      if (lVar1 == 0x118) {
        op = _OP_EXISTS;
      }
      else if (lVar1 != 0x3e) {
        return;
      }
      goto LAB_0014cb5a;
    }
    BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x14cb7c,0);
  } while( true );
}

Assistant:

void CompExp()
    {
        ShiftExp();
        for(;;) switch(_token) {
        case _SC('>'): BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_G); break;
        case _SC('<'): BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_L); break;
        case TK_GE: BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_GE); break;
        case TK_LE: BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_LE); break;
        case TK_IN: BIN_EXP(_OP_EXISTS, &SQCompiler::ShiftExp); break;
        case TK_INSTANCEOF: BIN_EXP(_OP_INSTANCEOF, &SQCompiler::ShiftExp); break;
        default: return;
        }
    }